

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unShift(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  uint *puVar1;
  uint uVar2;
  SPxOut *pSVar3;
  undefined8 uVar4;
  pointer pnVar5;
  char cVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  fpclass_type fVar11;
  undefined8 *puVar12;
  Status **ppSVar13;
  pointer pnVar14;
  long lVar15;
  int32_t iVar16;
  cpp_dec_float<50U,_int,_void> *pcVar17;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<50U,_int,_void> local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> *local_110;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> local_c8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_88;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_80;
  Status **local_78;
  Status **local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar3 = this->spxout;
  if ((pSVar3 != (SPxOut *)0x0) &&
     (local_108.data._M_elems[0] = pSVar3->m_verbosity, 4 < (int)local_108.data._M_elems[0])) {
    local_148.data._M_elems[0] = 5;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"DSHIFT07 = ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity],"unshifting ...",0xe);
    cVar6 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) +
                    cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])();
  }
  if (this->initialized == true) {
    local_108.fpclass = cpp_dec_float_finite;
    local_108.prec_elem = 10;
    local_108.data._M_elems[0] = 0;
    local_108.data._M_elems[1] = 0;
    local_108.data._M_elems[2] = 0;
    local_108.data._M_elems[3] = 0;
    local_108.data._M_elems[4] = 0;
    local_108.data._M_elems[5] = 0;
    local_108.data._M_elems[6] = 0;
    local_108.data._M_elems[7] = 0;
    local_108.data._M_elems[8] = 0;
    local_108.data._M_elems[9] = 0;
    local_108.exp = 0;
    local_108.neg = false;
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.exp = 0;
    local_148.neg = false;
    local_110 = &(this->theShift).m_backend;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_110,0);
    if (this->theType == ENTER) {
      entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,this);
      uVar2 = (this->thecovectors->set).thenum;
      uVar19 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          uVar20 = uVar19 + 1;
          local_88 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          lVar15 = uVar19 * 0x38;
          do {
            local_c8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[uVar20 - 2].super_DataKey;
            pCVar18 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
            if (local_c8.data._M_elems[0] < 1) {
              pCVar18 = local_88;
            }
            iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(pCVar18,(DataKey *)&local_c8);
            if ((int)local_c8.data._M_elems[0] < 0) {
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_108.data._M_elems[0] = pnVar14[iVar10].m_backend.data._M_elems[0];
              local_108.data._M_elems[9] = pnVar14[iVar10].m_backend.data._M_elems[9];
              puVar1 = pnVar14[iVar10].m_backend.data._M_elems + 5;
              uVar4 = *(undefined8 *)puVar1;
              uVar7 = *(undefined8 *)(puVar1 + 2);
              puVar1 = pnVar14[iVar10].m_backend.data._M_elems + 1;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_108.exp = pnVar14[iVar10].m_backend.exp;
              fVar11 = pnVar14[iVar10].m_backend.fpclass;
              iVar16 = pnVar14[iVar10].m_backend.prec_elem;
              local_108.neg =
                   (bool)((local_108.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite) ^
                         pnVar14[iVar10].m_backend.neg);
              local_108.data._M_elems[5] = (uint)uVar4;
              local_108.data._M_elems[6] = (uint)((ulong)uVar4 >> 0x20);
              local_108.data._M_elems[7] = (uint)uVar7;
              local_108.data._M_elems[8] = (uint)((ulong)uVar7 >> 0x20);
              local_108.data._M_elems[1] = (uint)uVar8;
              local_108.data._M_elems[2] = (uint)((ulong)uVar8 >> 0x20);
              local_108.data._M_elems[3] = (uint)uVar9;
              local_108.data._M_elems[4] = (uint)((ulong)uVar9 >> 0x20);
              local_108.prec_elem = iVar16;
              local_108.fpclass = fVar11;
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_148.data._M_elems[0] = pnVar14[iVar10].m_backend.data._M_elems[0];
              local_188.data._M_elems[8] = pnVar14[iVar10].m_backend.data._M_elems[9];
              puVar1 = pnVar14[iVar10].m_backend.data._M_elems + 5;
              uVar4 = *(undefined8 *)puVar1;
              uVar7 = *(undefined8 *)(puVar1 + 2);
              local_188.data._M_elems[4] = (uint)uVar4;
              local_188.data._M_elems[5] = (uint)((ulong)uVar4 >> 0x20);
              local_188.data._M_elems[6] = (uint)uVar7;
              local_188.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
              puVar1 = pnVar14[iVar10].m_backend.data._M_elems + 1;
              uVar4 = *(undefined8 *)puVar1;
              uVar7 = *(undefined8 *)(puVar1 + 2);
              local_188.data._M_elems[0] = (uint)uVar4;
              local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
              local_188.data._M_elems[2] = (uint)uVar7;
              local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_148.exp = pnVar14[iVar10].m_backend.exp;
              local_148.fpclass = pnVar14[iVar10].m_backend.fpclass;
              local_148.prec_elem = pnVar14[iVar10].m_backend.prec_elem;
              local_148.neg =
                   (bool)((local_148.fpclass != cpp_dec_float_finite ||
                          local_148.data._M_elems[0] != 0) ^ pnVar14[iVar10].m_backend.neg);
              local_148.data._M_elems[1] = local_188.data._M_elems[0];
              local_148.data._M_elems[2] = local_188.data._M_elems[1];
              local_148.data._M_elems[3] = local_188.data._M_elems[2];
              local_148.data._M_elems[4] = local_188.data._M_elems[3];
              local_148.data._M_elems[5] = local_188.data._M_elems[4];
              local_148.data._M_elems[6] = local_188.data._M_elems[5];
              local_148.data._M_elems[7] = local_188.data._M_elems[6];
              local_148.data._M_elems[8] = local_188.data._M_elems[7];
              local_148.data._M_elems[9] = local_188.data._M_elems[8];
            }
            else {
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)(pnVar14[iVar10].m_backend.data._M_elems + 8);
              local_108.data._M_elems[8] = (uint)uVar4;
              local_108.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
              uVar4 = *(undefined8 *)&pnVar14[iVar10].m_backend.data;
              uVar7 = *(undefined8 *)(pnVar14[iVar10].m_backend.data._M_elems + 2);
              puVar1 = pnVar14[iVar10].m_backend.data._M_elems + 4;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_108.data._M_elems[4] = (uint)uVar8;
              local_108.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_108.data._M_elems[6] = (uint)uVar9;
              local_108.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_108.data._M_elems[0] = (uint)uVar4;
              local_108.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
              local_108.data._M_elems[2] = (uint)uVar7;
              local_108.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_108.exp = pnVar14[iVar10].m_backend.exp;
              local_108.neg = pnVar14[iVar10].m_backend.neg;
              fVar11 = pnVar14[iVar10].m_backend.fpclass;
              iVar16 = pnVar14[iVar10].m_backend.prec_elem;
              local_108.prec_elem = iVar16;
              local_108.fpclass = fVar11;
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)(pnVar14[iVar10].m_backend.data._M_elems + 8);
              local_148.data._M_elems[8] = (uint)uVar4;
              local_148.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
              uVar4 = *(undefined8 *)&pnVar14[iVar10].m_backend.data;
              uVar7 = *(undefined8 *)(pnVar14[iVar10].m_backend.data._M_elems + 2);
              puVar1 = pnVar14[iVar10].m_backend.data._M_elems + 4;
              uVar8 = *(undefined8 *)puVar1;
              uVar9 = *(undefined8 *)(puVar1 + 2);
              local_148.data._M_elems[4] = (uint)uVar8;
              local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_148.data._M_elems[6] = (uint)uVar9;
              local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_148.data._M_elems[0] = (uint)uVar4;
              local_148.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
              local_148.data._M_elems[2] = (uint)uVar7;
              local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_148.exp = pnVar14[iVar10].m_backend.exp;
              local_148.neg = pnVar14[iVar10].m_backend.neg;
              local_148.fpclass = pnVar14[iVar10].m_backend.fpclass;
              local_148.prec_elem = pnVar14[iVar10].m_backend.prec_elem;
            }
            if ((fVar11 == cpp_dec_float_NaN) || (local_148.fpclass == cpp_dec_float_NaN)) {
LAB_00238be0:
              pnVar14 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[8] = local_108.data._M_elems[8];
              local_188.data._M_elems[9] = local_108.data._M_elems[9];
              local_188.data._M_elems[4] = local_108.data._M_elems[4];
              local_188.data._M_elems[5] = local_108.data._M_elems[5];
              local_188.data._M_elems[6] = local_108.data._M_elems[6];
              local_188.data._M_elems[7] = local_108.data._M_elems[7];
              local_188.data._M_elems[0] = local_108.data._M_elems[0];
              local_188.data._M_elems[1] = local_108.data._M_elems[1];
              local_188.data._M_elems[2] = local_108.data._M_elems[2];
              local_188.data._M_elems[3] = local_108.data._M_elems[3];
              local_188.prec_elem = iVar16;
              local_188.fpclass = fVar11;
              local_188.exp = local_108.exp;
              local_188.neg = local_108.neg;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_188,&local_68);
              if (((*(int *)((long)(&pnVar14[0xffffffffffffffff].m_backend.data + 1) + lVar15 + 8U)
                    == 2) || (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar15),&local_188), -1 < iVar10)) {
                pnVar14 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar14[0xffffffffffffffff].m_backend.data + 1) + lVar15 + 8U
                              ) != 2) && (local_108.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar15),&local_108), 0 < iVar10)) {
                  pnVar14 = (this->theUBbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                    local_188.data._M_elems[8] = (uint)puVar12[4];
                    local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                    local_188.data._M_elems[4] = (uint)puVar12[2];
                    local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                    local_188.data._M_elems[6] = (uint)puVar12[3];
                    local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                    local_188.data._M_elems[0] = (uint)*puVar12;
                    local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                    local_188.data._M_elems[2] = (uint)puVar12[1];
                    local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                    local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                    local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U)
                    ;
                    local_188._48_8_ =
                         *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_108);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_110,&local_188);
                }
              }
              else {
                pnVar14 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x20) =
                     CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x10);
                *puVar12 = CONCAT44(local_108.data._M_elems[5],local_108.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[7],local_108.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[1],local_108.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[3],local_108.data._M_elems[2]);
                *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15) = local_108.exp;
                *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U) = local_108.neg;
                *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) =
                     local_108._48_8_;
              }
              pnVar14 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[8] = local_148.data._M_elems[8];
              local_188.data._M_elems[9] = local_148.data._M_elems[9];
              local_188.data._M_elems[4] = local_148.data._M_elems[4];
              local_188.data._M_elems[5] = local_148.data._M_elems[5];
              local_188.data._M_elems[6] = local_148.data._M_elems[6];
              local_188.data._M_elems[7] = local_148.data._M_elems[7];
              local_188.data._M_elems[0] = local_148.data._M_elems[0];
              local_188.data._M_elems[1] = local_148.data._M_elems[1];
              local_188.data._M_elems[2] = local_148.data._M_elems[2];
              local_188.data._M_elems[3] = local_148.data._M_elems[3];
              local_188.exp = local_148.exp;
              local_188.neg = local_148.neg;
              local_188.fpclass = local_148.fpclass;
              local_188.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,&local_68);
              if (((*(int *)((long)(&pnVar14[0xffffffffffffffff].m_backend.data + 1) + lVar15 + 8U)
                    == 2) || (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar15),&local_188), iVar10 < 1)) {
                pnVar14 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar14[0xffffffffffffffff].m_backend.data + 1) + lVar15 + 8U
                              ) != 2) && (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar15),&local_148), iVar10 < 0)) {
                  pnVar14 = (this->theLBbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                    local_188.data._M_elems[8] = (uint)puVar12[4];
                    local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                    local_188.data._M_elems[4] = (uint)puVar12[2];
                    local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                    local_188.data._M_elems[6] = (uint)puVar12[3];
                    local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                    local_188.data._M_elems[0] = (uint)*puVar12;
                    local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                    local_188.data._M_elems[2] = (uint)puVar12[1];
                    local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                    local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                    local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U)
                    ;
                    local_188._48_8_ =
                         *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_148);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (local_110,&local_188);
                }
              }
              else {
                pnVar14 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x20) =
                     CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x10);
                *puVar12 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                *puVar12 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15) = local_148.exp;
                *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U) = local_148.neg;
                *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) =
                     local_148._48_8_;
              }
            }
            else {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_108,&local_148);
              if (iVar10 != 0) {
                fVar11 = local_108.fpclass;
                iVar16 = local_108.prec_elem;
                goto LAB_00238be0;
              }
              pnVar14 = (this->theUBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) == 2) ||
                  (local_108.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                      &local_108), iVar10 < 1)) {
                pnVar14 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                        &local_148), iVar10 < 0)) {
                  pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(this->theLBbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if (pcVar17 != &local_188) {
                    local_188.data._M_elems[8] = local_148.data._M_elems[8];
                    local_188.data._M_elems[9] = local_148.data._M_elems[9];
                    local_188.data._M_elems[4] = local_148.data._M_elems[4];
                    local_188.data._M_elems[5] = local_148.data._M_elems[5];
                    local_188.data._M_elems[6] = local_148.data._M_elems[6];
                    local_188.data._M_elems[7] = local_148.data._M_elems[7];
                    local_188.data._M_elems[0] = local_148.data._M_elems[0];
                    local_188.data._M_elems[1] = local_148.data._M_elems[1];
                    local_188.data._M_elems[2] = local_148.data._M_elems[2];
                    local_188.data._M_elems[3] = local_148.data._M_elems[3];
                    local_188.exp = local_148.exp;
                    local_188.neg = local_148.neg;
                    local_188.fpclass = local_148.fpclass;
                    local_188.prec_elem = local_148.prec_elem;
                    goto LAB_0023902d;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_148);
                  if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite)
                  {
                    local_188.neg = (bool)(local_188.neg ^ 1);
                  }
                  goto LAB_00239032;
                }
              }
              else {
                pnVar14 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  local_188.data._M_elems[8] = (uint)puVar12[4];
                  local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                  local_188.data._M_elems[4] = (uint)puVar12[2];
                  local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                  local_188.data._M_elems[6] = (uint)puVar12[3];
                  local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                  local_188.data._M_elems[0] = (uint)*puVar12;
                  local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                  local_188.data._M_elems[2] = (uint)puVar12[1];
                  local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                  local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                  local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                }
                pcVar17 = &local_108;
LAB_0023902d:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,pcVar17);
LAB_00239032:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
            }
            uVar20 = uVar20 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar20);
        }
        lVar15 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar15) {
          uVar19 = lVar15 + 1;
          lVar15 = lVar15 * 0x38;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar19 - 2] < 1) {
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_108.data._M_elems[0] =
                   *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              local_108.data._M_elems[9] =
                   *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x24);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x14);
              uVar4 = *puVar12;
              uVar7 = puVar12[1];
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 4);
              uVar8 = *puVar12;
              uVar9 = puVar12[1];
              local_108.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
              local_108._48_8_ =
                   *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
              local_108.neg =
                   (bool)((local_108.data._M_elems[0] != 0 ||
                          local_108.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U));
              local_108.data._M_elems[5] = (uint)uVar4;
              local_108.data._M_elems[6] = (uint)((ulong)uVar4 >> 0x20);
              local_108.data._M_elems[7] = (uint)uVar7;
              local_108.data._M_elems[8] = (uint)((ulong)uVar7 >> 0x20);
              local_108.data._M_elems[1] = (uint)uVar8;
              local_108.data._M_elems[2] = (uint)((ulong)uVar8 >> 0x20);
              local_108.data._M_elems[3] = (uint)uVar9;
              local_108.data._M_elems[4] = (uint)((ulong)uVar9 >> 0x20);
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_148.data._M_elems[0] =
                   *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              local_188.data._M_elems[8] =
                   *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x24);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x14);
              uVar4 = *puVar12;
              uVar7 = puVar12[1];
              local_188.data._M_elems[4] = (uint)uVar4;
              local_188.data._M_elems[5] = (uint)((ulong)uVar4 >> 0x20);
              local_188.data._M_elems[6] = (uint)uVar7;
              local_188.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 4);
              uVar4 = *puVar12;
              uVar7 = puVar12[1];
              local_188.data._M_elems[0] = (uint)uVar4;
              local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
              local_188.data._M_elems[2] = (uint)uVar7;
              local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_148.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
              local_148._48_8_ =
                   *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
              local_148.neg =
                   (bool)((local_148.data._M_elems[0] != 0 ||
                          local_148.fpclass != cpp_dec_float_finite) ^
                         *(byte *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U));
              pnVar14 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_148.data._M_elems[1] = local_188.data._M_elems[0];
              local_148.data._M_elems[2] = local_188.data._M_elems[1];
              local_148.data._M_elems[3] = local_188.data._M_elems[2];
              local_148.data._M_elems[4] = local_188.data._M_elems[3];
              local_148.data._M_elems[5] = local_188.data._M_elems[4];
              local_148.data._M_elems[6] = local_188.data._M_elems[5];
              local_148.data._M_elems[7] = local_188.data._M_elems[6];
              local_148.data._M_elems[8] = local_188.data._M_elems[7];
              local_148.data._M_elems[9] = local_188.data._M_elems[8];
              if (((*(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2) &&
                  (local_108.fpclass != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                      &local_108), 0 < iVar10)) {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  local_188.data._M_elems[8] = (uint)puVar12[4];
                  local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                  local_188.data._M_elems[4] = (uint)puVar12[2];
                  local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                  local_188.data._M_elems[6] = (uint)puVar12[3];
                  local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                  local_188.data._M_elems[0] = (uint)*puVar12;
                  local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                  local_188.data._M_elems[2] = (uint)puVar12[1];
                  local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                  local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                  local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_108);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
              if (((local_148.fpclass != cpp_dec_float_NaN) &&
                  (pnVar14 = (this->theLRbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_148,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15)),
                 0 < iVar10)) {
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if (pcVar17 == &local_188) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_148);
                  if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite)
                  {
                    local_188.neg = (bool)(local_188.neg ^ 1);
                  }
                }
                else {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.exp = local_148.exp;
                  local_188.neg = local_148.neg;
                  local_188.fpclass = local_148.fpclass;
                  local_188.prec_elem = local_148.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,pcVar17);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
            }
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
        lVar15 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar15) {
          uVar19 = lVar15 + 1;
          lVar15 = lVar15 * 0x38;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar19 - 2] < 1) {
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x20);
              local_108.data._M_elems[8] = (uint)uVar4;
              local_108.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              uVar4 = *puVar12;
              uVar7 = puVar12[1];
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x10);
              uVar8 = *puVar12;
              uVar9 = puVar12[1];
              local_108.data._M_elems[4] = (uint)uVar8;
              local_108.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_108.data._M_elems[6] = (uint)uVar9;
              local_108.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_108.data._M_elems[0] = (uint)uVar4;
              local_108.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
              local_108.data._M_elems[2] = (uint)uVar7;
              local_108.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_108.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
              local_108.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
              local_108._48_8_ =
                   *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
              pnVar14 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x20);
              local_148.data._M_elems[8] = (uint)uVar4;
              local_148.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              uVar4 = *puVar12;
              uVar7 = puVar12[1];
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15 + 0x10);
              uVar8 = *puVar12;
              uVar9 = puVar12[1];
              local_148.data._M_elems[4] = (uint)uVar8;
              local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
              local_148.data._M_elems[6] = (uint)uVar9;
              local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
              local_148.data._M_elems[0] = (uint)uVar4;
              local_148.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
              local_148.data._M_elems[2] = (uint)uVar7;
              local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
              local_148.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
              local_148.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
              local_148._48_8_ =
                   *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
              pnVar14 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2) &&
                  (local_108.fpclass != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                      &local_108), 0 < iVar10)) {
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  local_188.data._M_elems[8] = (uint)puVar12[4];
                  local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                  local_188.data._M_elems[4] = (uint)puVar12[2];
                  local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                  local_188.data._M_elems[6] = (uint)puVar12[3];
                  local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                  local_188.data._M_elems[0] = (uint)*puVar12;
                  local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                  local_188.data._M_elems[2] = (uint)puVar12[1];
                  local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                  local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                  local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_108);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
              if (((local_148.fpclass != cpp_dec_float_NaN) &&
                  (pnVar14 = (this->theLCbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_148,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15)),
                 0 < iVar10)) {
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if (pcVar17 == &local_188) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_148);
                  if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite)
                  {
                    local_188.neg = (bool)(local_188.neg ^ 1);
                  }
                }
                else {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.exp = local_148.exp;
                  local_188.neg = local_148.neg;
                  local_188.fpclass = local_148.fpclass;
                  local_188.prec_elem = local_148.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,pcVar17);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
            }
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
      }
      else {
        if (0 < (int)uVar2) {
          lVar15 = uVar19 * 0x38;
          uVar19 = uVar19 + 1;
          local_80 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          local_88 = &(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set;
          local_70 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
          local_78 = &(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.rowstat.data;
          do {
            local_c8.data._M_elems._0_8_ =
                 (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).theBaseId.data[uVar19 - 2].super_DataKey;
            pCVar18 = local_88;
            if (local_c8.data._M_elems[0] < 1) {
              pCVar18 = local_80;
            }
            iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(pCVar18,(DataKey *)&local_c8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_148,0);
            local_108.data._M_elems[0] = local_148.data._M_elems[0];
            local_108.data._M_elems[1] = local_148.data._M_elems[1];
            local_108.data._M_elems[2] = local_148.data._M_elems[2];
            local_108.data._M_elems[3] = local_148.data._M_elems[3];
            local_108.data._M_elems[4] = local_148.data._M_elems[4];
            local_108.data._M_elems[5] = local_148.data._M_elems[5];
            local_108.data._M_elems[6] = local_148.data._M_elems[6];
            local_108.data._M_elems[7] = local_148.data._M_elems[7];
            local_108.data._M_elems[8] = local_148.data._M_elems[8];
            local_108.data._M_elems[9] = local_148.data._M_elems[9];
            local_108.exp = local_148.exp;
            local_108.neg = local_148.neg;
            local_108.fpclass = local_148.fpclass;
            local_108.prec_elem = local_148.prec_elem;
            ppSVar13 = local_70;
            if ((int)local_c8.data._M_elems[0] < 0) {
              ppSVar13 = local_78;
            }
            clearDualBounds(this,(*ppSVar13)[iVar10],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_108,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148);
            pnVar14 = (this->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar10 = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
            if ((iVar10 == 2) ||
               (pnVar5 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar15 + -8) == 2)) {
LAB_0023a60e:
              if ((iVar10 != 2) && (local_108.fpclass != cpp_dec_float_NaN)) {
                iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),&local_108)
                ;
                pnVar14 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (0 < iVar10) {
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                    uVar4 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
                    local_188.data._M_elems[8] = (uint)uVar4;
                    local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                    uVar4 = *puVar12;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30);
                    uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20);
                    local_188.data._M_elems[4] = (uint)uVar8;
                    local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_188.data._M_elems[6] = (uint)uVar9;
                    local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_188.data._M_elems[0] = (uint)uVar4;
                    local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                    local_188.data._M_elems[2] = (uint)uVar7;
                    local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_188.exp =
                         *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                    local_188.neg =
                         *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                    local_188._48_8_ =
                         *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_108);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_110,&local_188);
                  goto LAB_0023a758;
                }
              }
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              local_188.fpclass = cpp_dec_float_finite;
              local_188.prec_elem = 10;
              local_188.data._M_elems[0] = 0;
              local_188.data._M_elems[1] = 0;
              local_188.data._M_elems[2] = 0;
              local_188.data._M_elems[3] = 0;
              local_188.data._M_elems[4] = 0;
              local_188.data._M_elems[5] = 0;
              local_188.data._M_elems[6] = 0;
              local_188.data._M_elems[7] = 0;
              local_188.data._M_elems[8] = 0;
              local_188.data._M_elems[9] = 0;
              local_188.exp = 0;
              local_188.neg = false;
              if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
                local_188.data._M_elems[8] = (uint)uVar4;
                local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                uVar4 = *puVar12;
                uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30);
                uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20);
                local_188.data._M_elems[4] = (uint)uVar8;
                local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                local_188.data._M_elems[6] = (uint)uVar9;
                local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                local_188.data._M_elems[0] = (uint)uVar4;
                local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                local_188.data._M_elems[2] = (uint)uVar7;
                local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                local_188.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                local_188.neg = *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                local_188._48_8_ =
                     *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
              }
              pcVar17 = &local_108;
LAB_0023a746:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,pcVar17);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (local_110,&local_188);
            }
            else {
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                  (cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar5[-1].m_backend.data._M_elems + lVar15));
              if (iVar10 != 0) {
                pnVar14 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar10 = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                goto LAB_0023a60e;
              }
              pnVar14 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[8] = local_108.data._M_elems[8];
              local_188.data._M_elems[9] = local_108.data._M_elems[9];
              local_188.data._M_elems[4] = local_108.data._M_elems[4];
              local_188.data._M_elems[5] = local_108.data._M_elems[5];
              local_188.data._M_elems[6] = local_108.data._M_elems[6];
              local_188.data._M_elems[7] = local_108.data._M_elems[7];
              local_188.data._M_elems[0] = local_108.data._M_elems[0];
              local_188.data._M_elems[1] = local_108.data._M_elems[1];
              local_188.data._M_elems[2] = local_108.data._M_elems[2];
              local_188.data._M_elems[3] = local_108.data._M_elems[3];
              local_188.exp = local_108.exp;
              local_188.neg = local_108.neg;
              local_188.fpclass = local_108.fpclass;
              local_188.prec_elem = local_108.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,&local_68);
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                  (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar15),&local_188), -1 < iVar10)) {
                pnVar14 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) != 2) &&
                    (local_108.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar15),&local_108), 0 < iVar10)) {
                  pnVar14 = (this->theUBbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                    uVar4 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
                    local_188.data._M_elems[8] = (uint)uVar4;
                    local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                    uVar4 = *puVar12;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30);
                    uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20);
                    local_188.data._M_elems[4] = (uint)uVar8;
                    local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_188.data._M_elems[6] = (uint)uVar9;
                    local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_188.data._M_elems[0] = (uint)uVar4;
                    local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                    local_188.data._M_elems[2] = (uint)uVar7;
                    local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_188.exp =
                         *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                    local_188.neg =
                         *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                    local_188._48_8_ =
                         *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_108);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_110,&local_188);
                }
              }
              else {
                pnVar14 = (this->theUBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                     CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[5],local_108.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[7],local_108.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[1],local_108.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[3],local_108.data._M_elems[2]);
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) = local_108.exp;
                *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) = local_108.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                     local_108._48_8_;
              }
              pnVar14 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[8] = local_148.data._M_elems[8];
              local_188.data._M_elems[9] = local_148.data._M_elems[9];
              local_188.data._M_elems[4] = local_148.data._M_elems[4];
              local_188.data._M_elems[5] = local_148.data._M_elems[5];
              local_188.data._M_elems[6] = local_148.data._M_elems[6];
              local_188.data._M_elems[7] = local_148.data._M_elems[7];
              local_188.data._M_elems[0] = local_148.data._M_elems[0];
              local_188.data._M_elems[1] = local_148.data._M_elems[1];
              local_188.data._M_elems[2] = local_148.data._M_elems[2];
              local_188.data._M_elems[3] = local_148.data._M_elems[3];
              local_188.exp = local_148.exp;
              local_188.neg = local_148.neg;
              local_188.fpclass = local_148.fpclass;
              local_188.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_188,&local_68);
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                  (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar15),&local_188), iVar10 < 1)) {
                pnVar14 = (this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                    (local_148.fpclass == cpp_dec_float_NaN)) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar15),&local_148), -1 < iVar10)) goto LAB_0023a758;
                pnVar14 = (this->theLBbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                }
                pcVar17 = &local_148;
                goto LAB_0023a746;
              }
              pnVar14 = (this->theLBbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                   CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
              *puVar12 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar12[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              *puVar12 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar12[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) = local_148.exp;
              *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) = local_148.neg;
              *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                   local_148._48_8_;
            }
LAB_0023a758:
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
        lVar15 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar15) {
          uVar19 = lVar15 + 1;
          lVar15 = lVar15 * 0x38;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar19 - 2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&local_148,0);
              local_108.data._M_elems[0] = local_148.data._M_elems[0];
              local_108.data._M_elems[1] = local_148.data._M_elems[1];
              local_108.data._M_elems[2] = local_148.data._M_elems[2];
              local_108.data._M_elems[3] = local_148.data._M_elems[3];
              local_108.data._M_elems[4] = local_148.data._M_elems[4];
              local_108.data._M_elems[5] = local_148.data._M_elems[5];
              local_108.data._M_elems[6] = local_148.data._M_elems[6];
              local_108.data._M_elems[7] = local_148.data._M_elems[7];
              local_108.data._M_elems[8] = local_148.data._M_elems[8];
              local_108.data._M_elems[9] = local_148.data._M_elems[9];
              local_108.exp = local_148.exp;
              local_108.neg = local_148.neg;
              local_108.fpclass = local_148.fpclass;
              local_108.prec_elem = local_148.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.rowstat.data[uVar19 - 2],
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_108,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_148);
              pnVar14 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2) &&
                  (local_108.fpclass != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                      &local_108), 0 < iVar10)) {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  local_188.data._M_elems[8] = (uint)puVar12[4];
                  local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                  local_188.data._M_elems[4] = (uint)puVar12[2];
                  local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                  local_188.data._M_elems[6] = (uint)puVar12[3];
                  local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                  local_188.data._M_elems[0] = (uint)*puVar12;
                  local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                  local_188.data._M_elems[2] = (uint)puVar12[1];
                  local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                  local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                  local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_108);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
              if (((local_148.fpclass != cpp_dec_float_NaN) &&
                  (pnVar14 = (this->theLRbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_148,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15)),
                 0 < iVar10)) {
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if (pcVar17 == &local_188) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_148);
                  if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite)
                  {
                    local_188.neg = (bool)(local_188.neg ^ 1);
                  }
                }
                else {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.exp = local_148.exp;
                  local_188.neg = local_148.neg;
                  local_188.fpclass = local_148.fpclass;
                  local_188.prec_elem = local_148.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,pcVar17);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
            }
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
        lVar15 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar15) {
          uVar19 = lVar15 + 1;
          lVar15 = lVar15 * 0x38;
          do {
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar19 - 2] < 1) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&local_148,0);
              local_108.data._M_elems[0] = local_148.data._M_elems[0];
              local_108.data._M_elems[1] = local_148.data._M_elems[1];
              local_108.data._M_elems[2] = local_148.data._M_elems[2];
              local_108.data._M_elems[3] = local_148.data._M_elems[3];
              local_108.data._M_elems[4] = local_148.data._M_elems[4];
              local_108.data._M_elems[5] = local_148.data._M_elems[5];
              local_108.data._M_elems[6] = local_148.data._M_elems[6];
              local_108.data._M_elems[7] = local_148.data._M_elems[7];
              local_108.data._M_elems[8] = local_148.data._M_elems[8];
              local_108.data._M_elems[9] = local_148.data._M_elems[9];
              local_108.exp = local_148.exp;
              local_108.neg = local_148.neg;
              local_108.fpclass = local_148.fpclass;
              local_108.prec_elem = local_148.prec_elem;
              clearDualBounds(this,(this->
                                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).thedesc.colstat.data[uVar19 - 2],
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_108,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_148);
              pnVar14 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2) &&
                  (local_108.fpclass != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                      &local_108), 0 < iVar10)) {
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  local_188.data._M_elems[8] = (uint)puVar12[4];
                  local_188.data._M_elems[9] = (uint)((ulong)puVar12[4] >> 0x20);
                  local_188.data._M_elems[4] = (uint)puVar12[2];
                  local_188.data._M_elems[5] = (uint)((ulong)puVar12[2] >> 0x20);
                  local_188.data._M_elems[6] = (uint)puVar12[3];
                  local_188.data._M_elems[7] = (uint)((ulong)puVar12[3] >> 0x20);
                  local_188.data._M_elems[0] = (uint)*puVar12;
                  local_188.data._M_elems[1] = (uint)((ulong)*puVar12 >> 0x20);
                  local_188.data._M_elems[2] = (uint)puVar12[1];
                  local_188.data._M_elems[3] = (uint)((ulong)puVar12[1] >> 0x20);
                  local_188.exp = *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15);
                  local_188.neg = *(bool *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 4U);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_108);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
              if (((local_148.fpclass != cpp_dec_float_NaN) &&
                  (pnVar14 = (this->theLCbound).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                  *(int *)((long)(&pnVar14[-1].m_backend.data + 1) + lVar15 + 8U) != 2)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_148,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15)),
                 0 < iVar10)) {
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if (pcVar17 == &local_188) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_148);
                  if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite)
                  {
                    local_188.neg = (bool)(local_188.neg ^ 1);
                  }
                }
                else {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.exp = local_148.exp;
                  local_188.neg = local_148.neg;
                  local_188.fpclass = local_148.fpclass;
                  local_188.prec_elem = local_148.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,pcVar17);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
            }
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
      }
    }
    else {
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,this);
      uVar2 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar19 = (ulong)uVar2;
      if (this->theRep == COLUMN) {
        if (0 < (int)uVar2) {
          lVar15 = uVar19 * 0x38;
          uVar19 = uVar19 + 1;
          do {
            pnVar14 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .object.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
            local_148.data._M_elems[8] = (uint)uVar4;
            local_148.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
            puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
            uVar8 = *puVar12;
            uVar9 = puVar12[1];
            local_148.data._M_elems[4] = (uint)uVar8;
            local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar9;
            local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            local_148.data._M_elems[0] = (uint)uVar4;
            local_148.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar7;
            local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_148.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
            local_148.neg = *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
            local_148.fpclass =
                 *(fpclass_type *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
            local_148.prec_elem =
                 *(int32_t *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -4);
            local_108.prec_elem = local_148.prec_elem;
            local_108.fpclass = local_148.fpclass;
            local_108.data._M_elems[0] = local_148.data._M_elems[0];
            local_108.data._M_elems[1] = local_148.data._M_elems[1];
            local_108.data._M_elems[2] = local_148.data._M_elems[2];
            local_108.data._M_elems[3] = local_148.data._M_elems[3];
            local_108.data._M_elems[4] = local_148.data._M_elems[4];
            local_108.data._M_elems[5] = local_148.data._M_elems[5];
            local_108.data._M_elems[6] = local_148.data._M_elems[6];
            local_108.data._M_elems[7] = local_148.data._M_elems[7];
            local_108.data._M_elems[8] = local_148.data._M_elems[8];
            local_108.data._M_elems[9] = local_148.data._M_elems[9];
            local_108.exp = local_148.exp;
            local_108.neg = local_148.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.rowstat.data[uVar19 - 2],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_108,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148);
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[uVar19 - 2] < 1) {
              pnVar14 = (this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[8] = local_108.data._M_elems[8];
              local_188.data._M_elems[9] = local_108.data._M_elems[9];
              local_188.data._M_elems[4] = local_108.data._M_elems[4];
              local_188.data._M_elems[5] = local_108.data._M_elems[5];
              local_188.data._M_elems[6] = local_108.data._M_elems[6];
              local_188.data._M_elems[7] = local_108.data._M_elems[7];
              local_188.data._M_elems[0] = local_108.data._M_elems[0];
              local_188.data._M_elems[1] = local_108.data._M_elems[1];
              local_188.data._M_elems[2] = local_108.data._M_elems[2];
              local_188.data._M_elems[3] = local_108.data._M_elems[3];
              local_188.exp = local_108.exp;
              local_188.neg = local_108.neg;
              local_188.fpclass = local_108.fpclass;
              local_188.prec_elem = local_108.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_188,&local_68);
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                  (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar15),&local_188), -1 < iVar10)) {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_108);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
              else {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                     CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[5],local_108.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[7],local_108.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[1],local_108.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[3],local_108.data._M_elems[2]);
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) = local_108.exp;
                *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) = local_108.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                     local_108._48_8_;
                if (((local_108.fpclass != cpp_dec_float_NaN) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_108,&local_148), iVar10 == 0)) {
                  pnVar14 = (this->theLRbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                       CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                  puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                  *puVar12 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                  puVar12[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  *puVar12 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                  puVar12[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                  *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) =
                       local_148.exp;
                  *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) =
                       local_148.neg;
                  *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                       local_148._48_8_;
                }
              }
              pnVar14 = (this->theCoPvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[8] = local_148.data._M_elems[8];
              local_188.data._M_elems[9] = local_148.data._M_elems[9];
              local_188.data._M_elems[4] = local_148.data._M_elems[4];
              local_188.data._M_elems[5] = local_148.data._M_elems[5];
              local_188.data._M_elems[6] = local_148.data._M_elems[6];
              local_188.data._M_elems[7] = local_148.data._M_elems[7];
              local_188.data._M_elems[0] = local_148.data._M_elems[0];
              local_188.data._M_elems[1] = local_148.data._M_elems[1];
              local_188.data._M_elems[2] = local_148.data._M_elems[2];
              local_188.data._M_elems[3] = local_148.data._M_elems[3];
              local_188.exp = local_148.exp;
              local_188.neg = local_148.neg;
              local_188.fpclass = local_148.fpclass;
              local_188.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,&local_68);
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                  (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar15),&local_188), iVar10 < 1)) {
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                if (pcVar17 == &local_188) goto LAB_002385a3;
LAB_0023885b:
                local_188.data._M_elems[8] = local_148.data._M_elems[8];
                local_188.data._M_elems[9] = local_148.data._M_elems[9];
                local_188.data._M_elems[4] = local_148.data._M_elems[4];
                local_188.data._M_elems[5] = local_148.data._M_elems[5];
                local_188.data._M_elems[6] = local_148.data._M_elems[6];
                local_188.data._M_elems[7] = local_148.data._M_elems[7];
                local_188.data._M_elems[0] = local_148.data._M_elems[0];
                local_188.data._M_elems[1] = local_148.data._M_elems[1];
                local_188.data._M_elems[2] = local_148.data._M_elems[2];
                local_188.data._M_elems[3] = local_148.data._M_elems[3];
                local_188.exp = local_148.exp;
                local_188.neg = local_148.neg;
                local_188.fpclass = local_148.fpclass;
                local_188.prec_elem = local_148.prec_elem;
                goto LAB_00238897;
              }
              pnVar14 = (this->theLRbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                   CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
              *puVar12 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar12[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
              *puVar12 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar12[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) = local_148.exp;
              *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) = local_148.neg;
              *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                   local_148._48_8_;
              if (((local_108.fpclass != cpp_dec_float_NaN) &&
                  (local_148.fpclass != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_108,&local_148), iVar10 == 0)) {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                     CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[5],local_108.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[7],local_108.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                *puVar12 = CONCAT44(local_108.data._M_elems[1],local_108.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[3],local_108.data._M_elems[2]);
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) = local_108.exp;
                *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) = local_108.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                     local_108._48_8_;
              }
            }
            else {
              pnVar14 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                  (local_108.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                      &local_108), iVar10 < 1)) {
                pnVar14 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                    (local_148.fpclass == cpp_dec_float_NaN)) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                        &local_148), -1 < iVar10)) goto LAB_002388a9;
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                if (pcVar17 != &local_188) goto LAB_0023885b;
LAB_002385a3:
                local_188.neg = false;
                local_188.exp = 0;
                local_188.data._M_elems[9] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_148);
                if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
                  local_188.neg = (bool)(local_188.neg ^ 1);
                }
              }
              else {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                pcVar17 = &local_108;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                }
LAB_00238897:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,pcVar17);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_110,&local_188);
            }
LAB_002388a9:
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
        lVar15 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar15) {
          lVar21 = lVar15 * 0x38;
          uVar19 = lVar15 + 1;
          do {
            pnVar14 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .object.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_148.data._M_elems[0] =
                 *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
            local_188.data._M_elems[8] =
                 *(uint *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x14);
            puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x24);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            local_188.data._M_elems[4] = (uint)uVar4;
            local_188.data._M_elems[5] = (uint)((ulong)uVar4 >> 0x20);
            local_188.data._M_elems[6] = (uint)uVar7;
            local_188.data._M_elems[7] = (uint)((ulong)uVar7 >> 0x20);
            puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x34);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            local_188.data._M_elems[0] = (uint)uVar4;
            local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_188.data._M_elems[2] = (uint)uVar7;
            local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_148.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
            local_148.fpclass =
                 *(fpclass_type *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
            local_148.prec_elem =
                 *(int32_t *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -4);
            local_148.neg =
                 (bool)((local_148.data._M_elems[0] != 0 ||
                        local_148.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc));
            local_108.data._M_elems[3] = local_188.data._M_elems[2];
            local_108.data._M_elems[4] = local_188.data._M_elems[3];
            local_108.data._M_elems[5] = local_188.data._M_elems[4];
            local_108.data._M_elems[6] = local_188.data._M_elems[5];
            local_108.data._M_elems[7] = local_188.data._M_elems[6];
            local_108.data._M_elems[8] = local_188.data._M_elems[7];
            local_108.prec_elem = local_148.prec_elem;
            local_108.fpclass = local_148.fpclass;
            local_148.data._M_elems[1] = local_188.data._M_elems[0];
            local_148.data._M_elems[2] = local_188.data._M_elems[1];
            local_148.data._M_elems[3] = local_188.data._M_elems[2];
            local_148.data._M_elems[4] = local_188.data._M_elems[3];
            local_148.data._M_elems[5] = local_188.data._M_elems[4];
            local_148.data._M_elems[6] = local_188.data._M_elems[5];
            local_148.data._M_elems[7] = local_188.data._M_elems[6];
            local_148.data._M_elems[8] = local_188.data._M_elems[7];
            local_148.data._M_elems[9] = local_188.data._M_elems[8];
            local_108.data._M_elems[0] = local_148.data._M_elems[0];
            local_108.data._M_elems[1] = local_188.data._M_elems[0];
            local_108.data._M_elems[2] = local_188.data._M_elems[1];
            local_108.data._M_elems[9] = local_188.data._M_elems[8];
            local_108.exp = local_148.exp;
            local_108.neg = local_148.neg;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.colstat.data[uVar19 - 2],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_108);
            fVar11 = local_108.fpclass;
            if (this->theRep *
                (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[uVar19 - 2] < 1) {
              pnVar14 = (this->thePvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[0] = local_108.data._M_elems[0];
              local_188.data._M_elems[9] = local_108.data._M_elems[9];
              local_188.data._M_elems[5] = local_108.data._M_elems[5];
              local_188.data._M_elems[6] = local_108.data._M_elems[6];
              local_188.data._M_elems[7] = local_108.data._M_elems[7];
              local_188.data._M_elems[8] = local_108.data._M_elems[8];
              local_188.data._M_elems[1] = local_108.data._M_elems[1];
              local_188.data._M_elems[2] = local_108.data._M_elems[2];
              local_188.data._M_elems[3] = local_108.data._M_elems[3];
              local_188.data._M_elems[4] = local_108.data._M_elems[4];
              local_188.exp = local_108.exp;
              local_188.neg =
                   (bool)((local_108.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite) ^
                         local_108.neg);
              local_188.fpclass = local_108.fpclass;
              local_188.prec_elem = local_108.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_188,&local_68);
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                  (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_188), -1 < iVar10)) {
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_c8.data._M_elems[1] = local_108.data._M_elems[1];
                local_c8.data._M_elems[0] = local_108.data._M_elems[0];
                local_c8.data._M_elems[3] = local_108.data._M_elems[3];
                local_c8.data._M_elems[2] = local_108.data._M_elems[2];
                local_c8.data._M_elems[5] = local_108.data._M_elems[5];
                local_c8.data._M_elems[4] = local_108.data._M_elems[4];
                local_c8.data._M_elems[7] = local_108.data._M_elems[7];
                local_c8.data._M_elems[6] = local_108.data._M_elems[6];
                local_c8.data._M_elems[9] = local_108.data._M_elems[9];
                local_c8.data._M_elems[8] = local_108.data._M_elems[8];
                local_c8.exp = local_108.exp;
                local_c8.neg = local_108.neg;
                local_c8.fpclass = local_108.fpclass;
                local_c8.prec_elem = local_108.prec_elem;
                if (local_108.fpclass != cpp_dec_float_finite || local_108.data._M_elems[0] != 0) {
                  local_c8.neg = (bool)(local_108.neg ^ 1);
                }
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_c8);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
              else {
                local_188.data._M_elems[0] = local_108.data._M_elems[1];
                local_188.data._M_elems[1] = local_108.data._M_elems[2];
                local_188.data._M_elems[2] = local_108.data._M_elems[3];
                local_188.data._M_elems[3] = local_108.data._M_elems[4];
                local_188.data._M_elems[4] = local_108.data._M_elems[5];
                local_188.data._M_elems[5] = local_108.data._M_elems[6];
                local_188.data._M_elems[6] = local_108.data._M_elems[7];
                local_188.data._M_elems[7] = local_108.data._M_elems[8];
                local_188.data._M_elems[8] = local_108.data._M_elems[9];
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21) =
                     local_108.data._M_elems[0];
                puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x34);
                *puVar12 = CONCAT44(local_108.data._M_elems[2],local_108.data._M_elems[1]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[4],local_108.data._M_elems[3]);
                puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x24);
                *puVar12 = CONCAT44(local_108.data._M_elems[6],local_108.data._M_elems[5]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[8],local_108.data._M_elems[7]);
                *(uint *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x14) =
                     local_108.data._M_elems[9];
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10) = local_108.exp;
                *(char *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc) =
                     (local_108.data._M_elems[0] != 0 || local_108.fpclass != cpp_dec_float_finite)
                     ^ local_108.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) =
                     local_108._48_8_;
                if (((local_108.fpclass != cpp_dec_float_NaN) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_108,&local_148), iVar10 == 0)) {
                  pnVar14 = (this->theLCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21) =
                       local_148.data._M_elems[0];
                  puVar12 = (undefined8 *)
                            ((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x34);
                  *puVar12 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
                  puVar12[1] = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
                  puVar12 = (undefined8 *)
                            ((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x24);
                  *puVar12 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
                  puVar12[1] = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
                  *(uint *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x14) =
                       local_148.data._M_elems[9];
                  *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10) =
                       local_148.exp;
                  *(char *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc) =
                       (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite
                       ) ^ local_148.neg;
                  *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) =
                       local_148._48_8_;
                }
              }
              pnVar14 = (this->thePvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[0] = local_148.data._M_elems[0];
              local_188.data._M_elems[9] = local_148.data._M_elems[9];
              local_188.data._M_elems[5] = local_148.data._M_elems[5];
              local_188.data._M_elems[6] = local_148.data._M_elems[6];
              local_188.data._M_elems[7] = local_148.data._M_elems[7];
              local_188.data._M_elems[8] = local_148.data._M_elems[8];
              local_188.data._M_elems[1] = local_148.data._M_elems[1];
              local_188.data._M_elems[2] = local_148.data._M_elems[2];
              local_188.data._M_elems[3] = local_148.data._M_elems[3];
              local_188.data._M_elems[4] = local_148.data._M_elems[4];
              local_188.exp = local_148.exp;
              local_188.neg =
                   (bool)((local_148.data._M_elems[0] != 0 ||
                          local_148.fpclass != cpp_dec_float_finite) ^ local_148.neg);
              local_188.fpclass = local_148.fpclass;
              local_188.prec_elem = local_148.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_188,&local_68);
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                  (local_188.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                      lVar21),&local_188), iVar10 < 1)) {
                local_c8.data._M_elems[1] = local_148.data._M_elems[1];
                local_c8.data._M_elems[0] = local_148.data._M_elems[0];
                local_c8.data._M_elems[3] = local_148.data._M_elems[3];
                local_c8.data._M_elems[2] = local_148.data._M_elems[2];
                local_c8.data._M_elems[5] = local_148.data._M_elems[5];
                local_c8.data._M_elems[4] = local_148.data._M_elems[4];
                local_c8.data._M_elems[7] = local_148.data._M_elems[7];
                local_c8.data._M_elems[6] = local_148.data._M_elems[6];
                local_c8.data._M_elems[9] = local_148.data._M_elems[9];
                local_c8.data._M_elems[8] = local_148.data._M_elems[8];
                local_c8.exp = local_148.exp;
                local_c8.neg = local_148.neg;
                fVar11 = local_148.fpclass;
                iVar16 = local_148.prec_elem;
                local_c8.fpclass = local_148.fpclass;
                local_c8.prec_elem = local_148.prec_elem;
                if (local_148.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite) {
LAB_00239d32:
                  local_c8.neg = (bool)(local_148.neg ^ 1);
                  local_c8.exp = local_148.exp;
                  local_c8._48_8_ = local_148._48_8_;
                }
LAB_00239d3c:
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                local_148.exp = local_c8.exp;
                local_148._48_8_ = local_c8._48_8_;
                if (pcVar17 != &local_188) {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.prec_elem = iVar16;
                  local_188.fpclass = fVar11;
                  local_188.exp = local_c8.exp;
                  local_188.neg = local_c8.neg;
                  goto LAB_00239da5;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_c8);
                if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
                  local_188.neg = (bool)(local_188.neg ^ 1);
                }
                goto LAB_00239daa;
              }
              local_188.data._M_elems[0] = local_148.data._M_elems[1];
              local_188.data._M_elems[1] = local_148.data._M_elems[2];
              local_188.data._M_elems[2] = local_148.data._M_elems[3];
              local_188.data._M_elems[3] = local_148.data._M_elems[4];
              local_188.data._M_elems[4] = local_148.data._M_elems[5];
              local_188.data._M_elems[5] = local_148.data._M_elems[6];
              local_188.data._M_elems[6] = local_148.data._M_elems[7];
              local_188.data._M_elems[7] = local_148.data._M_elems[8];
              local_188.data._M_elems[8] = local_148.data._M_elems[9];
              pnVar14 = (this->theLCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21) =
                   local_148.data._M_elems[0];
              puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x34);
              *puVar12 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
              puVar12[1] = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
              puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x24);
              *puVar12 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
              puVar12[1] = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
              *(uint *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x14) =
                   local_148.data._M_elems[9];
              *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10) = local_148.exp;
              *(char *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc) =
                   (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite) ^
                   local_148.neg;
              *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) =
                   local_148._48_8_;
              if (((local_108.fpclass != cpp_dec_float_NaN) &&
                  (local_148.fpclass != cpp_dec_float_NaN)) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_108,&local_148), iVar10 == 0)) {
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21) =
                     local_108.data._M_elems[0];
                puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x34);
                *puVar12 = CONCAT44(local_108.data._M_elems[2],local_108.data._M_elems[1]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[4],local_108.data._M_elems[3]);
                puVar12 = (undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x24);
                *puVar12 = CONCAT44(local_108.data._M_elems[6],local_108.data._M_elems[5]);
                puVar12[1] = CONCAT44(local_108.data._M_elems[8],local_108.data._M_elems[7]);
                *(uint *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x14) =
                     local_108.data._M_elems[9];
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10) = local_108.exp;
                *(char *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc) =
                     (local_108.data._M_elems[0] != 0 || local_108.fpclass != cpp_dec_float_finite)
                     ^ local_108.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) =
                     local_108._48_8_;
              }
            }
            else {
              pnVar14 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_188.data._M_elems[0] = local_108.data._M_elems[0];
              local_188.data._M_elems[1] = local_108.data._M_elems[1];
              local_188.data._M_elems[2] = local_108.data._M_elems[2];
              local_188.data._M_elems[3] = local_108.data._M_elems[3];
              local_188.data._M_elems[8] = local_108.data._M_elems[8];
              local_188.data._M_elems[9] = local_108.data._M_elems[9];
              local_188.data._M_elems[4] = local_108.data._M_elems[4];
              local_188.data._M_elems[5] = local_108.data._M_elems[5];
              local_188.data._M_elems[6] = local_108.data._M_elems[6];
              local_188.data._M_elems[7] = local_108.data._M_elems[7];
              local_188.exp = local_108.exp;
              local_188.neg = local_108.neg;
              local_188.fpclass = local_108.fpclass;
              local_188.prec_elem = local_108.prec_elem;
              if (local_108.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite) {
                local_188.neg = (bool)(local_108.neg ^ 1);
              }
              if (((fVar11 == cpp_dec_float_NaN) ||
                  (*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) == 2)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar21),
                                      &local_188), iVar10 < 1)) {
                pnVar14 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_188.data._M_elems[0] = local_148.data._M_elems[0];
                local_188.data._M_elems[1] = local_148.data._M_elems[1];
                local_188.data._M_elems[2] = local_148.data._M_elems[2];
                local_188.data._M_elems[3] = local_148.data._M_elems[3];
                local_188.data._M_elems[8] = local_148.data._M_elems[8];
                local_188.data._M_elems[9] = local_148.data._M_elems[9];
                local_188.data._M_elems[4] = local_148.data._M_elems[4];
                local_188.data._M_elems[5] = local_148.data._M_elems[5];
                local_188.data._M_elems[6] = local_148.data._M_elems[6];
                local_188.data._M_elems[7] = local_148.data._M_elems[7];
                local_188.exp = local_148.exp;
                local_188.neg = local_148.neg;
                local_188.fpclass = local_148.fpclass;
                local_188.prec_elem = local_148.prec_elem;
                if (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite) {
                  local_188.neg = (bool)(local_148.neg ^ 1);
                }
                if (((local_148.fpclass != cpp_dec_float_NaN) &&
                    (*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) != 2)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar21),
                                        &local_188), iVar10 < 0)) {
                  local_c8.data._M_elems[1] = local_148.data._M_elems[1];
                  local_c8.data._M_elems[0] = local_148.data._M_elems[0];
                  local_c8.data._M_elems[3] = local_148.data._M_elems[3];
                  local_c8.data._M_elems[2] = local_148.data._M_elems[2];
                  local_c8.data._M_elems[5] = local_148.data._M_elems[5];
                  local_c8.data._M_elems[4] = local_148.data._M_elems[4];
                  local_c8.data._M_elems[7] = local_148.data._M_elems[7];
                  local_c8.data._M_elems[6] = local_148.data._M_elems[6];
                  local_c8.data._M_elems[9] = local_148.data._M_elems[9];
                  local_c8.data._M_elems[8] = local_148.data._M_elems[8];
                  local_c8.exp = local_148.exp;
                  local_c8.neg = local_148.neg;
                  fVar11 = local_148.fpclass;
                  iVar16 = local_148.prec_elem;
                  local_c8.fpclass = local_148.fpclass;
                  local_c8.prec_elem = local_148.prec_elem;
                  if (local_148.data._M_elems[0] != 0 || fVar11 != cpp_dec_float_finite)
                  goto LAB_00239d32;
                  goto LAB_00239d3c;
                }
              }
              else {
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_c8.data._M_elems[1] = local_108.data._M_elems[1];
                local_c8.data._M_elems[0] = local_108.data._M_elems[0];
                local_c8.data._M_elems[3] = local_108.data._M_elems[3];
                local_c8.data._M_elems[2] = local_108.data._M_elems[2];
                local_c8.data._M_elems[5] = local_108.data._M_elems[5];
                local_c8.data._M_elems[4] = local_108.data._M_elems[4];
                local_c8.data._M_elems[7] = local_108.data._M_elems[7];
                local_c8.data._M_elems[6] = local_108.data._M_elems[6];
                local_c8.data._M_elems[9] = local_108.data._M_elems[9];
                local_c8.data._M_elems[8] = local_108.data._M_elems[8];
                local_c8.exp = local_108.exp;
                local_c8.neg = local_108.neg;
                local_c8.fpclass = local_108.fpclass;
                local_c8.prec_elem = local_108.prec_elem;
                if (local_108.fpclass != cpp_dec_float_finite || local_108.data._M_elems[0] != 0) {
                  local_c8.neg = (bool)(local_108.neg ^ 1);
                }
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
                }
                pcVar17 = &local_c8;
LAB_00239da5:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,pcVar17);
LAB_00239daa:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_110,&local_188);
              }
            }
            uVar19 = uVar19 - 1;
            lVar21 = lVar21 + -0x38;
          } while (1 < uVar19);
        }
      }
      else {
        if (0 < (int)uVar2) {
          lVar15 = uVar19 * 0x38;
          uVar19 = uVar19 + 1;
          do {
            pnVar14 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
            local_108.data._M_elems[8] = (uint)uVar4;
            local_108.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
            puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
            uVar8 = *puVar12;
            uVar9 = puVar12[1];
            local_108.data._M_elems[4] = (uint)uVar8;
            local_108.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_108.data._M_elems[6] = (uint)uVar9;
            local_108.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            pcVar17 = &local_108;
            local_108.data._M_elems[0] = (uint)uVar4;
            local_108.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_108.data._M_elems[2] = (uint)uVar7;
            local_108.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_108.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
            local_108.neg = *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
            local_108._48_8_ =
                 *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
            pnVar14 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
            local_148.data._M_elems[8] = (uint)uVar4;
            local_148.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
            puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
            uVar8 = *puVar12;
            uVar9 = puVar12[1];
            local_148.data._M_elems[4] = (uint)uVar8;
            local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar9;
            local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            local_148.data._M_elems[0] = (uint)uVar4;
            local_148.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar7;
            local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_148.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
            local_148.neg = *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
            local_148._48_8_ =
                 *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
            if (((local_108.fpclass == cpp_dec_float_NaN) ||
                (local_148.fpclass == cpp_dec_float_NaN)) ||
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar17,&local_148), iVar10 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[uVar19 - 2] < 1) {
                pnVar14 = (this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_188.data._M_elems[8] = local_108.data._M_elems[8];
                local_188.data._M_elems[9] = local_108.data._M_elems[9];
                local_188.data._M_elems[4] = local_108.data._M_elems[4];
                local_188.data._M_elems[5] = local_108.data._M_elems[5];
                local_188.data._M_elems[6] = local_108.data._M_elems[6];
                local_188.data._M_elems[7] = local_108.data._M_elems[7];
                local_188.data._M_elems[0] = local_108.data._M_elems[0];
                local_188.data._M_elems[1] = local_108.data._M_elems[1];
                local_188.data._M_elems[2] = local_108.data._M_elems[2];
                local_188.data._M_elems[3] = local_108.data._M_elems[3];
                local_188.exp = local_108.exp;
                local_188.neg = local_108.neg;
                local_188.fpclass = local_108.fpclass;
                local_188.prec_elem = local_108.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_188,&local_68);
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                    (local_188.fpclass == cpp_dec_float_NaN)) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar15),&local_188), -1 < iVar10)) {
                  pnVar14 = (this->theURbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                    uVar4 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18);
                    local_188.data._M_elems[8] = (uint)uVar4;
                    local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                    uVar4 = *puVar12;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30);
                    uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20);
                    local_188.data._M_elems[4] = (uint)uVar8;
                    local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_188.data._M_elems[6] = (uint)uVar9;
                    local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_188.data._M_elems[0] = (uint)uVar4;
                    local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                    local_188.data._M_elems[2] = (uint)uVar7;
                    local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_188.exp =
                         *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                    local_188.neg =
                         *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                    local_188._48_8_ =
                         *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_108);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_110,&local_188);
                }
                else {
                  pnVar14 = (this->theURbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                       CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
                  puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                  *puVar12 = CONCAT44(local_108.data._M_elems[5],local_108.data._M_elems[4]);
                  puVar12[1] = CONCAT44(local_108.data._M_elems[7],local_108.data._M_elems[6]);
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                  *puVar12 = CONCAT44(local_108.data._M_elems[1],local_108.data._M_elems[0]);
                  puVar12[1] = CONCAT44(local_108.data._M_elems[3],local_108.data._M_elems[2]);
                  *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) =
                       local_108.exp;
                  *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) =
                       local_108.neg;
                  *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                       local_108._48_8_;
                }
                pnVar14 = (this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_188.data._M_elems[8] = local_148.data._M_elems[8];
                local_188.data._M_elems[9] = local_148.data._M_elems[9];
                local_188.data._M_elems[4] = local_148.data._M_elems[4];
                local_188.data._M_elems[5] = local_148.data._M_elems[5];
                local_188.data._M_elems[6] = local_148.data._M_elems[6];
                local_188.data._M_elems[7] = local_148.data._M_elems[7];
                local_188.data._M_elems[0] = local_148.data._M_elems[0];
                local_188.data._M_elems[1] = local_148.data._M_elems[1];
                local_188.data._M_elems[2] = local_148.data._M_elems[2];
                local_188.data._M_elems[3] = local_148.data._M_elems[3];
                local_188.exp = local_148.exp;
                local_188.neg = local_148.neg;
                local_188.fpclass = local_148.fpclass;
                local_188.prec_elem = local_148.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_68);
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                    (local_188.fpclass == cpp_dec_float_NaN)) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar15),&local_188), iVar10 < 1)) {
                  pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(this->theLRbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar15);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if (pcVar17 == &local_188) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_188,&local_148);
                    if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite
                       ) goto LAB_00239574;
                  }
                  else {
                    local_188.data._M_elems[8] = local_148.data._M_elems[8];
                    local_188.data._M_elems[9] = local_148.data._M_elems[9];
                    local_188.data._M_elems[4] = local_148.data._M_elems[4];
                    local_188.data._M_elems[5] = local_148.data._M_elems[5];
                    local_188.data._M_elems[6] = local_148.data._M_elems[6];
                    local_188.data._M_elems[7] = local_148.data._M_elems[7];
                    local_188.data._M_elems[0] = local_148.data._M_elems[0];
                    local_188.data._M_elems[1] = local_148.data._M_elems[1];
                    local_188.data._M_elems[2] = local_148.data._M_elems[2];
                    local_188.data._M_elems[3] = local_148.data._M_elems[3];
                    local_188.exp = local_148.exp;
                    local_188.neg = local_148.neg;
                    local_188.fpclass = local_148.fpclass;
                    local_188.prec_elem = local_148.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_188,pcVar17);
                  }
                  goto LAB_00239579;
                }
                pnVar14 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18) =
                     CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                *puVar12 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                *puVar12 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10) = local_148.exp;
                *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc) = local_148.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) =
                     local_148._48_8_;
              }
              else {
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) != 2) &&
                    (local_108.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),pcVar17
                                       ), 0 < iVar10)) goto LAB_002393d9;
                pnVar14 = (this->theLRbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) != 2) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),
                                        &local_148), iVar10 < 0)) goto LAB_0023944e;
              }
            }
            else {
              pnVar14 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8) == 2) ||
                  (local_108.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar15),pcVar17),
                 iVar10 < 1)) {
LAB_0023944e:
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLRbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if (pcVar17 != &local_188) {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.exp = local_148.exp;
                  local_188.neg = local_148.neg;
                  local_188.fpclass = local_148.fpclass;
                  local_188.prec_elem = local_148.prec_elem;
                  goto LAB_002394c6;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_148);
                if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
LAB_00239574:
                  local_188.neg = (bool)(local_188.neg ^ 1);
                }
              }
              else {
LAB_002393d9:
                pnVar14 = (this->theURbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar15);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar15);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar15 + -8);
                }
LAB_002394c6:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,pcVar17);
              }
LAB_00239579:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_110,&local_188);
            }
            uVar19 = uVar19 - 1;
            lVar15 = lVar15 + -0x38;
          } while (1 < uVar19);
        }
        lVar15 = (long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
        if (0 < lVar15) {
          lVar21 = lVar15 * 0x38;
          uVar19 = lVar15 + 1;
          do {
            pnVar14 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18);
            local_108.data._M_elems[8] = (uint)uVar4;
            local_108.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
            puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
            uVar8 = *puVar12;
            uVar9 = puVar12[1];
            local_108.data._M_elems[4] = (uint)uVar8;
            local_108.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_108.data._M_elems[6] = (uint)uVar9;
            local_108.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            pcVar17 = &local_108;
            local_108.data._M_elems[0] = (uint)uVar4;
            local_108.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_108.data._M_elems[2] = (uint)uVar7;
            local_108.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_108.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
            local_108.neg = *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc);
            local_108._48_8_ =
                 *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
            pnVar14 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18);
            local_148.data._M_elems[8] = (uint)uVar4;
            local_148.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
            puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
            uVar4 = *puVar12;
            uVar7 = puVar12[1];
            puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
            uVar8 = *puVar12;
            uVar9 = puVar12[1];
            local_148.data._M_elems[4] = (uint)uVar8;
            local_148.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar9;
            local_148.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
            local_148.data._M_elems[0] = (uint)uVar4;
            local_148.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar7;
            local_148.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
            local_148.exp = *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
            local_148.neg = *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc);
            local_148._48_8_ =
                 *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
            if (((local_108.fpclass == cpp_dec_float_NaN) ||
                (local_148.fpclass == cpp_dec_float_NaN)) ||
               (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar17,&local_148), iVar10 != 0)) {
              if (this->theRep *
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[uVar19 - 2] < 1) {
                pnVar14 = (this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_188.data._M_elems[8] = local_108.data._M_elems[8];
                local_188.data._M_elems[9] = local_108.data._M_elems[9];
                local_188.data._M_elems[4] = local_108.data._M_elems[4];
                local_188.data._M_elems[5] = local_108.data._M_elems[5];
                local_188.data._M_elems[6] = local_108.data._M_elems[6];
                local_188.data._M_elems[7] = local_108.data._M_elems[7];
                local_188.data._M_elems[0] = local_108.data._M_elems[0];
                local_188.data._M_elems[1] = local_108.data._M_elems[1];
                local_188.data._M_elems[2] = local_108.data._M_elems[2];
                local_188.data._M_elems[3] = local_108.data._M_elems[3];
                local_188.exp = local_108.exp;
                local_188.neg = local_108.neg;
                local_188.fpclass = local_108.fpclass;
                local_188.prec_elem = local_108.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_188,&local_68);
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                    (local_188.fpclass == cpp_dec_float_NaN)) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar21),&local_188), -1 < iVar10)) {
                  pnVar14 = (this->theUCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                    uVar4 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18);
                    local_188.data._M_elems[8] = (uint)uVar4;
                    local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                    uVar4 = *puVar12;
                    uVar7 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x30);
                    uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
                    uVar9 = *(undefined8 *)
                             ((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x20);
                    local_188.data._M_elems[4] = (uint)uVar8;
                    local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                    local_188.data._M_elems[6] = (uint)uVar9;
                    local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                    local_188.data._M_elems[0] = (uint)uVar4;
                    local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                    local_188.data._M_elems[2] = (uint)uVar7;
                    local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                    local_188.exp =
                         *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
                    local_188.neg =
                         *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc);
                    local_188._48_8_ =
                         *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_188,&local_108);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (local_110,&local_188);
                }
                else {
                  pnVar14 = (this->theUCbound).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18) =
                       CONCAT44(local_108.data._M_elems[9],local_108.data._M_elems[8]);
                  puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
                  *puVar12 = CONCAT44(local_108.data._M_elems[5],local_108.data._M_elems[4]);
                  puVar12[1] = CONCAT44(local_108.data._M_elems[7],local_108.data._M_elems[6]);
                  puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
                  *puVar12 = CONCAT44(local_108.data._M_elems[1],local_108.data._M_elems[0]);
                  puVar12[1] = CONCAT44(local_108.data._M_elems[3],local_108.data._M_elems[2]);
                  *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10) =
                       local_108.exp;
                  *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc) =
                       local_108.neg;
                  *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) =
                       local_108._48_8_;
                }
                pnVar14 = (this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_188.data._M_elems[8] = local_148.data._M_elems[8];
                local_188.data._M_elems[9] = local_148.data._M_elems[9];
                local_188.data._M_elems[4] = local_148.data._M_elems[4];
                local_188.data._M_elems[5] = local_148.data._M_elems[5];
                local_188.data._M_elems[6] = local_148.data._M_elems[6];
                local_188.data._M_elems[7] = local_148.data._M_elems[7];
                local_188.data._M_elems[0] = local_148.data._M_elems[0];
                local_188.data._M_elems[1] = local_148.data._M_elems[1];
                local_188.data._M_elems[2] = local_148.data._M_elems[2];
                local_188.data._M_elems[3] = local_148.data._M_elems[3];
                local_188.exp = local_148.exp;
                local_188.neg = local_148.neg;
                local_188.fpclass = local_148.fpclass;
                local_188.prec_elem = local_148.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_68);
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                    (local_188.fpclass == cpp_dec_float_NaN)) ||
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[0xffffffffffffffff].m_backend.data._M_elems +
                                        lVar21),&local_188), iVar10 < 1)) {
                  pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(this->theLCbound).val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                   _M_elems + lVar21);
                  local_188.fpclass = cpp_dec_float_finite;
                  local_188.prec_elem = 10;
                  local_188.data._M_elems[0] = 0;
                  local_188.data._M_elems[1] = 0;
                  local_188.data._M_elems[2] = 0;
                  local_188.data._M_elems[3] = 0;
                  local_188.data._M_elems[4] = 0;
                  local_188.data._M_elems[5] = 0;
                  local_188.data._M_elems[6] = 0;
                  local_188.data._M_elems[7] = 0;
                  local_188.data._M_elems[8] = 0;
                  local_188.data._M_elems[9] = 0;
                  local_188.exp = 0;
                  local_188.neg = false;
                  if (pcVar17 == &local_188) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_188,&local_148);
                    if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite
                       ) goto LAB_0023a41a;
                  }
                  else {
                    local_188.data._M_elems[8] = local_148.data._M_elems[8];
                    local_188.data._M_elems[9] = local_148.data._M_elems[9];
                    local_188.data._M_elems[4] = local_148.data._M_elems[4];
                    local_188.data._M_elems[5] = local_148.data._M_elems[5];
                    local_188.data._M_elems[6] = local_148.data._M_elems[6];
                    local_188.data._M_elems[7] = local_148.data._M_elems[7];
                    local_188.data._M_elems[0] = local_148.data._M_elems[0];
                    local_188.data._M_elems[1] = local_148.data._M_elems[1];
                    local_188.data._M_elems[2] = local_148.data._M_elems[2];
                    local_188.data._M_elems[3] = local_148.data._M_elems[3];
                    local_188.exp = local_148.exp;
                    local_188.neg = local_148.neg;
                    local_188.fpclass = local_148.fpclass;
                    local_188.prec_elem = local_148.prec_elem;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&local_188,pcVar17);
                  }
                  goto LAB_0023a41f;
                }
                pnVar14 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18) =
                     CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar12 = (undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
                *puVar12 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar12[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
                *puVar12 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar12[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10) = local_148.exp;
                *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc) = local_148.neg;
                *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) =
                     local_148._48_8_;
              }
              else {
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) != 2) &&
                    (local_108.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar21),pcVar17
                                       ), 0 < iVar10)) goto LAB_0023a27f;
                pnVar14 = (this->theLCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) != 2) &&
                    (local_148.fpclass != cpp_dec_float_NaN)) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)pnVar14[-1].m_backend.data._M_elems + lVar21),
                                        &local_148), iVar10 < 0)) goto LAB_0023a2f4;
              }
            }
            else {
              pnVar14 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (((*(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8) == 2) ||
                  (local_108.fpclass == cpp_dec_float_NaN)) ||
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)pnVar14[-1].m_backend.data._M_elems + lVar21),pcVar17),
                 iVar10 < 1)) {
LAB_0023a2f4:
                pcVar17 = (cpp_dec_float<50U,_int,_void> *)
                          ((long)(this->theLCbound).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar21);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if (pcVar17 != &local_188) {
                  local_188.data._M_elems[8] = local_148.data._M_elems[8];
                  local_188.data._M_elems[9] = local_148.data._M_elems[9];
                  local_188.data._M_elems[4] = local_148.data._M_elems[4];
                  local_188.data._M_elems[5] = local_148.data._M_elems[5];
                  local_188.data._M_elems[6] = local_148.data._M_elems[6];
                  local_188.data._M_elems[7] = local_148.data._M_elems[7];
                  local_188.data._M_elems[0] = local_148.data._M_elems[0];
                  local_188.data._M_elems[1] = local_148.data._M_elems[1];
                  local_188.data._M_elems[2] = local_148.data._M_elems[2];
                  local_188.data._M_elems[3] = local_148.data._M_elems[3];
                  local_188.exp = local_148.exp;
                  local_188.neg = local_148.neg;
                  local_188.fpclass = local_148.fpclass;
                  local_188.prec_elem = local_148.prec_elem;
                  goto LAB_0023a36c;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,&local_148);
                if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
LAB_0023a41a:
                  local_188.neg = (bool)(local_188.neg ^ 1);
                }
              }
              else {
LAB_0023a27f:
                pnVar14 = (this->theUCbound).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar12 = (undefined8 *)((long)pnVar14[-1].m_backend.data._M_elems + lVar21);
                local_188.fpclass = cpp_dec_float_finite;
                local_188.prec_elem = 10;
                local_188.data._M_elems[0] = 0;
                local_188.data._M_elems[1] = 0;
                local_188.data._M_elems[2] = 0;
                local_188.data._M_elems[3] = 0;
                local_188.data._M_elems[4] = 0;
                local_188.data._M_elems[5] = 0;
                local_188.data._M_elems[6] = 0;
                local_188.data._M_elems[7] = 0;
                local_188.data._M_elems[8] = 0;
                local_188.data._M_elems[9] = 0;
                local_188.exp = 0;
                local_188.neg = false;
                if ((cpp_dec_float<50U,_int,_void> *)puVar12 != &local_188) {
                  uVar4 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x18)
                  ;
                  local_188.data._M_elems[8] = (uint)uVar4;
                  local_188.data._M_elems[9] = (uint)((ulong)uVar4 >> 0x20);
                  uVar4 = *puVar12;
                  uVar7 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x30)
                  ;
                  uVar8 = *(undefined8 *)((long)(&(pnVar14->m_backend).data + -1) + lVar21);
                  uVar9 = *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x20)
                  ;
                  local_188.data._M_elems[4] = (uint)uVar8;
                  local_188.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
                  local_188.data._M_elems[6] = (uint)uVar9;
                  local_188.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
                  local_188.data._M_elems[0] = (uint)uVar4;
                  local_188.data._M_elems[1] = (uint)((ulong)uVar4 >> 0x20);
                  local_188.data._M_elems[2] = (uint)uVar7;
                  local_188.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
                  local_188.exp =
                       *(int *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0x10);
                  local_188.neg =
                       *(bool *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -0xc);
                  local_188._48_8_ =
                       *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + lVar21 + -8);
                }
LAB_0023a36c:
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_188,pcVar17);
              }
LAB_0023a41f:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_110,&local_188);
            }
            uVar19 = uVar19 - 1;
            lVar21 = lVar21 + -0x38;
          } while (1 < uVar19);
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}